

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infowin_prepare(Window xid)

{
  infowin *piVar1;
  undefined1 local_c0 [4];
  uint16_t local_bc [2];
  uint d;
  uint b;
  uint h;
  uint w;
  wchar_t y;
  wchar_t x;
  XWindowAttributes xwa;
  Window tmp_win;
  infowin *iwin;
  Window xid_local;
  
  piVar1 = Infowin;
  Infowin->win = xid;
  XGetGeometry(Metadpy->dpy,xid,&xwa.screen,&w,&h,&b,&d,local_bc,local_c0);
  piVar1->x = (int16_t)w;
  piVar1->y = (int16_t)h;
  piVar1->x_save = (int16_t)w;
  piVar1->y_save = (int16_t)h;
  piVar1->w = (int16_t)b;
  piVar1->h = (int16_t)d;
  piVar1->b = local_bc[0];
  XGetWindowAttributes(Metadpy->dpy,xid,&y);
  piVar1->mask = xwa.all_event_masks;
  piVar1->field_0x23 = piVar1->field_0x23 & 0xfe | xwa.colormap._4_4_ != 0;
  piVar1->field_0x23 = piVar1->field_0x23 & 0xfd | 2;
  return 0;
}

Assistant:

static errr Infowin_prepare(Window xid)
{
	infowin *iwin = Infowin;

	Window tmp_win;
	XWindowAttributes xwa;
	int x, y;
	unsigned int w, h, b, d;

	/* Assign stuff */
	iwin->win = xid;

	/* Check For Error XXX Extract some ACTUAL data from 'xid' */
	XGetGeometry(Metadpy->dpy, xid, &tmp_win, &x, &y, &w, &h, &b, &d);

	/* Apply the above info */
	iwin->x = x;
	iwin->y = y;
	iwin->x_save = x;
	iwin->y_save = y;
	iwin->w = w;
	iwin->h = h;
	iwin->b = b;

	/* Check Error XXX Extract some more ACTUAL data */
	XGetWindowAttributes(Metadpy->dpy, xid, &xwa);

	/* Apply the above info */
	iwin->mask = xwa.your_event_mask;
	iwin->mapped = ((xwa.map_state == IsUnmapped) ? 0 : 1);

	/* And assume that we are exposed */
	iwin->redraw = 1;

	/* Success */
	return (0);
}